

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Counts * __thiscall Catch::Counts::operator-(Counts *this,Counts *other)

{
  long *in_RDX;
  long *in_RSI;
  Counts *in_RDI;
  Counts *diff;
  
  Counts(in_RDI);
  in_RDI->passed = *in_RSI - *in_RDX;
  in_RDI->failed = in_RSI[1] - in_RDX[1];
  in_RDI->failedButOk = in_RSI[2] - in_RDX[2];
  in_RDI->skipped = in_RSI[3] - in_RDX[3];
  return in_RDI;
}

Assistant:

Counts Counts::operator - ( Counts const& other ) const {
        Counts diff;
        diff.passed = passed - other.passed;
        diff.failed = failed - other.failed;
        diff.failedButOk = failedButOk - other.failedButOk;
        diff.skipped = skipped - other.skipped;
        return diff;
    }